

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::
PerformDefaultAction
          (FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)> *this,
          ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  Action<pstore::serialize::archive::void_type_(const_int_&)> *this_00;
  runtime_error *this_01;
  undefined1 local_58 [8];
  string message;
  tuple<const_int_&> local_30;
  OnCallSpec<pstore::serialize::archive::void_type_(const_int_&)> *local_28;
  OnCallSpec<pstore::serialize::archive::void_type_(const_int_&)> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)> *this_local;
  
  spec = (OnCallSpec<pstore::serialize::archive::void_type_(const_int_&)> *)call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)this;
  local_28 = FindOnCallSpec(this,args);
  if (local_28 == (OnCallSpec<pstore::serialize::archive::void_type_(const_int_&)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)spec,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<pstore::serialize::archive::void_type>::Exists();
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)local_58);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<pstore::serialize::archive::void_type>::Get();
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_00 = OnCallSpec<pstore::serialize::archive::void_type_(const_int_&)>::GetAction(local_28);
    std::tuple<const_int_&>::tuple(&local_30,(tuple<const_int_&> *)call_description_local);
    Action<pstore::serialize::archive::void_type_(const_int_&)>::Perform(this_00,&local_30);
  }
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }